

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall pugi::xpath_variable::set(xpath_variable *this,char_t *value)

{
  size_t sVar1;
  void *__dest;
  void *in_RSI;
  int *in_RDI;
  char_t *copy;
  size_t size;
  xpath_variable_string *var;
  bool local_1;
  
  if (*in_RDI == 3) {
    sVar1 = impl::anon_unknown_0::strlength((char_t *)0x128f49);
    __dest = (void *)(*(code *)impl::(anonymous_namespace)::
                               xml_memory_management_function_storage<int>::allocate)(sVar1 + 1);
    if (__dest == (void *)0x0) {
      local_1 = false;
    }
    else {
      memcpy(__dest,in_RSI,sVar1 + 1);
      if (*(long *)(in_RDI + 4) != 0) {
        (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                  deallocate)(*(undefined8 *)(in_RDI + 4));
      }
      *(void **)(in_RDI + 4) = __dest;
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

PUGI__FN bool xpath_variable::set(const char_t* value)
	{
		if (_type != xpath_type_string) return false;

		impl::xpath_variable_string* var = static_cast<impl::xpath_variable_string*>(this);

		// duplicate string
		size_t size = (impl::strlength(value) + 1) * sizeof(char_t);

		char_t* copy = static_cast<char_t*>(impl::xml_memory::allocate(size));
		if (!copy) return false;

		memcpy(copy, value, size);

		// replace old string
		if (var->value) impl::xml_memory::deallocate(var->value);
		var->value = copy;

		return true;
	}